

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall
cmCTestBZR::LogParser::ReportError(LogParser *this,int param_1,int param_2,char *msg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((this->BZR->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                           "Error parsing bzr log xml: ");
  poVar1 = std::operator<<(poVar1,msg);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void ReportError(int /*line*/, int /*column*/, const char* msg) override
  {
    this->BZR->Log << "Error parsing bzr log xml: " << msg << "\n";
  }